

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall TestOutput::printCurrentTestEnded(TestOutput *this,TestResult *res)

{
  size_t sVar1;
  TestResult *in_RSI;
  long *in_RDI;
  
  if (*(int *)((long)in_RDI + 0xc) < 1) {
    (**(code **)(*in_RDI + 0xb0))();
  }
  else {
    (**(code **)(*in_RDI + 0x58))(in_RDI," - ");
    sVar1 = TestResult::getCurrentTestTotalExecutionTime(in_RSI);
    (**(code **)(*in_RDI + 0x68))(in_RDI,sVar1);
    (**(code **)(*in_RDI + 0x58))(in_RDI," ms\n");
  }
  return;
}

Assistant:

void TestOutput::printCurrentTestEnded(const TestResult& res)
{
    if (verbose_ > level_quiet) {
        print(" - ");
        print(res.getCurrentTestTotalExecutionTime());
        print(" ms\n");
    }
    else {
        printProgressIndicator();
    }
}